

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::WrapOpKill::GetVoidTypeId(WrapOpKill *this)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Void void_type;
  Type local_40;
  
  uVar1 = *(uint32_t *)&(this->super_Pass).field_0x34;
  if (uVar1 == 0) {
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    local_40.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_40._28_8_ = 0;
    local_40.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_40.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_40._vptr_Type = (_func_int **)&PTR__Type_003aeaf0;
    uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,&local_40);
    *(uint32_t *)&(this->super_Pass).field_0x34 = uVar1;
    analysis::Type::~Type(&local_40);
  }
  return uVar1;
}

Assistant:

uint32_t WrapOpKill::GetVoidTypeId() {
  if (void_type_id_ != 0) {
    return void_type_id_;
  }

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Void void_type;
  void_type_id_ = type_mgr->GetTypeInstruction(&void_type);
  return void_type_id_;
}